

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRWriter.cpp
# Opt level: O0

BitMatrix * __thiscall
ZXing::QRCode::Writer::encode(Writer *this,string *contents,int width,int height)

{
  string *in_RDX;
  wstring *in_RSI;
  BitMatrix *in_RDI;
  string_view in_stack_ffffffffffffffc0;
  BitMatrix *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
  FromUtf8_abi_cxx11_(in_stack_ffffffffffffffc0);
  encode((Writer *)this_00,in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffc0);
  return in_RDI;
}

Assistant:

BitMatrix Writer::encode(const std::string& contents, int width, int height) const
{
	return encode(FromUtf8(contents), width, height);
}